

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grafmode.c
# Opt level: O0

errr finish_parse_grafmode(parser *p)

{
  _graphics_mode *p_Var1;
  int iVar2;
  int local_2c;
  int local_28;
  wchar_t i;
  wchar_t count;
  wchar_t max;
  graphics_mode *n;
  graphics_mode *mode;
  parser *p_local;
  
  i = L'\0';
  local_28 = 0;
  if (p != (parser *)0x0) {
    for (n = (graphics_mode *)parser_priv(p); n != (graphics_mode *)0x0; n = n->pNext) {
      if ((uint)i < (uint)n->grafID) {
        i = (wchar_t)n->grafID;
      }
      local_28 = local_28 + 1;
    }
  }
  if (graphics_modes != (graphics_mode *)0x0) {
    close_graphics_modes();
  }
  graphics_modes = (graphics_mode *)mem_zalloc((long)(local_28 + 1) * 0x170);
  if (p != (parser *)0x0) {
    n = (graphics_mode *)parser_priv(p);
    iVar2 = local_28;
    while (local_2c = iVar2 + -1, -1 < local_2c) {
      memcpy(graphics_modes + local_2c,n,0x170);
      graphics_modes[local_2c].pNext = graphics_modes + iVar2;
      n = n->pNext;
      iVar2 = local_2c;
    }
  }
  graphics_modes[local_28].pNext = (_graphics_mode *)0x0;
  graphics_modes[local_28].grafID = '\0';
  graphics_modes[local_28].alphablend = '\0';
  graphics_modes[local_28].overdrawRow = '\0';
  graphics_modes[local_28].overdrawMax = '\0';
  my_strcpy(graphics_modes[local_28].pref,"none",8);
  my_strcpy(graphics_modes[local_28].path,"",0x20);
  my_strcpy(graphics_modes[local_28].file,"",0x20);
  my_strcpy(graphics_modes[local_28].menuname,"None",0x20);
  graphics_mode_high_id = i;
  current_graphics_mode = graphics_modes + local_28;
  if (p != (parser *)0x0) {
    n = (graphics_mode *)parser_priv(p);
    while (n != (graphics_mode *)0x0) {
      p_Var1 = n->pNext;
      mem_free(n);
      n = p_Var1;
    }
    parser_setpriv(p,(void *)0x0);
    parser_destroy(p);
  }
  return 0;
}

Assistant:

static errr finish_parse_grafmode(struct parser *p) {
	graphics_mode *mode, *n;
	int max = 0;
	int count = 0;
	int i;
	
	/* See how many graphics modes we have and what the highest index is */
	if (p) {
		mode = parser_priv(p);
		while (mode) {
			if (mode->grafID > max) {
				max = mode->grafID;
			}
			count++;
			mode = mode->pNext;
		}
	}

	/* Copy the loaded modes to the global variable */
	if (graphics_modes) {
		close_graphics_modes();
	}

	graphics_modes = mem_zalloc(sizeof(graphics_mode) * (count+1));
	if (p) {
		mode = parser_priv(p);
		for (i = count-1; i >= 0; i--, mode = mode->pNext) {
			memcpy(&(graphics_modes[i]), mode, sizeof(graphics_mode));
			graphics_modes[i].pNext = &(graphics_modes[i+1]);
		}
	}

	/* Hardcode the no graphics option */
	graphics_modes[count].pNext = NULL;
	graphics_modes[count].grafID = GRAPHICS_NONE;
	graphics_modes[count].alphablend = 0;
	graphics_modes[count].overdrawRow = 0;
	graphics_modes[count].overdrawMax = 0;
	my_strcpy(graphics_modes[count].pref, "none", 8);
	my_strcpy(graphics_modes[count].path, "", 32);
	my_strcpy(graphics_modes[count].file, "", 32);
	my_strcpy(graphics_modes[count].menuname, "None", 32);

	graphics_mode_high_id = max;

	/* Set the default graphics mode to be no graphics */
	current_graphics_mode = &(graphics_modes[count]);

	if (p) {
		mode = parser_priv(p);
		while (mode) {
			n = mode->pNext;
			mem_free(mode);
			mode = n;
		}
	
		parser_setpriv(p, NULL);
		parser_destroy(p);
	}
	return PARSE_ERROR_NONE;
}